

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O1

void __thiscall Test_aistr_assign_Test::TestBody(Test_aistr_assign_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  char buf [10];
  AssertHelper AStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  char local_30 [16];
  
  local_30[8] = '\0';
  local_30[9] = '\0';
  local_30[0] = '\0';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    ai::checkPointerNotNull((char *)0x0);
    sVar3 = ai::length((char *)0x0,9);
    sVar4 = 9;
    if (sVar3 < 9) {
      sVar4 = sVar3;
    }
    memcpy(local_30,(void *)0x0,sVar4);
    local_30[sVar4] = '\0';
  }
  testing::Message::Message((Message *)&local_60);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x45,
             "Expected: ai::assign(buf, nullptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && ((long *)local_60._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
    local_60._M_dataplus._M_p = (pointer)0x0;
  }
  ai::checkPointerNotNull("1234");
  sVar3 = ai::length("1234",9);
  sVar4 = 9;
  if (sVar3 < 9) {
    sVar4 = sVar3;
  }
  memcpy(local_30,"1234",sVar4);
  local_30[sVar4] = '\0';
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  sVar4 = strlen(local_30);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_30,local_30 + sVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)&local_40,"std::string(buf)","\"1234\"",&local_60,(char (*) [5])0x132fe5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_40.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x48,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&AStack_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_60._M_dataplus._M_p + 8))();
      }
      local_60._M_dataplus._M_p = (pointer)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ai::checkPointerNotNull("");
    sVar3 = ai::length("",9);
    sVar4 = 9;
    if (sVar3 < 9) {
      sVar4 = sVar3;
    }
    memset(local_30,0,sVar4);
    local_30[sVar4] = '\0';
    local_60._M_dataplus._M_p = (pointer)paVar1;
    sVar4 = strlen(local_30);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_30,local_30 + sVar4);
    pcVar5 = "";
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
              ((internal *)&local_40,"std::string(buf)","\"\"",&local_60,(char (*) [1])0x134d29);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_40.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if (local_38.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar5 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x4a,pcVar5);
      testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&AStack_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0)) {
          (**(code **)(*(size_type *)local_60._M_dataplus._M_p + 8))();
        }
        local_60._M_dataplus._M_p = (pointer)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      ai::checkPointerNotNull("123456789");
      sVar3 = ai::length("123456789",9);
      sVar4 = 9;
      if (sVar3 < 9) {
        sVar4 = sVar3;
      }
      memcpy(local_30,"123456789",sVar4);
      local_30[sVar4] = '\0';
      local_60._M_dataplus._M_p = (pointer)paVar1;
      sVar4 = strlen(local_30);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_30,local_30 + sVar4)
      ;
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                ((internal *)&local_40,"std::string(buf)","\"123456789\"",&local_60,
                 (char (*) [10])"123456789");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_40.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        if (local_38.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((local_38.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_68,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x4d,pcVar5);
        testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&AStack_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(*(size_type *)local_60._M_dataplus._M_p + 8))();
          }
          local_60._M_dataplus._M_p = (pointer)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        ai::checkPointerNotNull("12345678901");
        sVar3 = ai::length("12345678901",9);
        sVar4 = 9;
        if (sVar3 < 9) {
          sVar4 = sVar3;
        }
        memcpy(local_30,"12345678901",sVar4);
        local_30[sVar4] = '\0';
        local_60._M_dataplus._M_p = (pointer)paVar1;
        sVar4 = strlen(local_30);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,local_30,local_30 + sVar4);
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                  ((internal *)&local_40,"std::string(buf)","\"123456789\"",&local_60,
                   (char (*) [10])"123456789");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if (local_40.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_60);
          if (local_38.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_68,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                     ,0x50,pcVar5);
          testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&AStack_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0)) {
              (**(code **)(*(size_type *)local_60._M_dataplus._M_p + 8))();
            }
            local_60._M_dataplus._M_p = (pointer)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  return;
}

Assistant:

TEST_F(Test_aistr, assign) {
    char buf[10] = {0};

    EXPECT_THROW(ai::assign(buf, nullptr), std::invalid_argument);

    ai::assign(buf, "1234");
    ASSERT_EQ(std::string(buf), "1234");
    ai::assign(buf, "");
    ASSERT_EQ(std::string(buf), "");

    ai::assign(buf, "123456789");
    ASSERT_EQ(std::string(buf), "123456789");

    ai::assign(buf, "12345678901");
    ASSERT_EQ(std::string(buf), "123456789");
}